

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree_test.cpp
# Opt level: O2

pint p_test_case_ptree_nomem_test(void)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int i;
  int iVar4;
  PMemVTable vtable;
  
  p_test_module_fail_counter = 0;
  p_libsys_init();
  for (iVar4 = 0; iVar4 != 3; iVar4 = iVar4 + 1) {
    lVar2 = p_tree_new(iVar4,compare_keys);
    if (lVar2 == 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/ptree_test.cpp"
             ,0x1ea);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    vtable.f_free = pmem_free;
    vtable.f_malloc = pmem_alloc;
    vtable.f_realloc = pmem_realloc;
    iVar1 = p_mem_set_vtable(&vtable);
    if (iVar1 != 1) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/ptree_test.cpp"
             ,0x1f0);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    lVar3 = p_tree_new(iVar4,compare_keys);
    if (lVar3 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/ptree_test.cpp"
             ,0x1f2);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    p_tree_insert(lVar2,1,10);
    iVar1 = p_tree_get_nnodes(lVar2);
    if (iVar1 != 0) {
      printf("%s:%d: check failed\n",
             "/workspace/llm4binary/github/license_c_cmakelists/saprykin[P]plibsys/tests/ptree_test.cpp"
             ,500);
      p_atomic_int_inc(&p_test_module_fail_counter);
    }
    p_mem_restore_vtable();
    p_tree_free(lVar2);
  }
  p_libsys_shutdown();
  return -(uint)(p_test_module_fail_counter != 0);
}

Assistant:

P_TEST_CASE_BEGIN (ptree_nomem_test)
{
	p_libsys_init ();

	PMemVTable vtable;

	for (int i = (int) P_TREE_TYPE_BINARY; i <= (int) P_TREE_TYPE_AVL; ++i) {
		PTree *tree = p_tree_new ((PTreeType) i, (PCompareFunc) compare_keys);
		P_TEST_CHECK (tree != NULL);

		vtable.f_free    = pmem_free;
		vtable.f_malloc  = pmem_alloc;
		vtable.f_realloc = pmem_realloc;

		P_TEST_CHECK (p_mem_set_vtable (&vtable) == TRUE);

		P_TEST_CHECK (p_tree_new ((PTreeType) i, (PCompareFunc) compare_keys) == NULL);
		p_tree_insert (tree, PINT_TO_POINTER (1), PINT_TO_POINTER (10));
		P_TEST_CHECK (p_tree_get_nnodes (tree) == 0);

		p_mem_restore_vtable ();

		p_tree_free (tree);
	}

	p_libsys_shutdown ();
}